

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertUTF.cpp
# Opt level: O1

ConversionResult
llvm::ConvertUTF32toUTF16
          (UTF32 **sourceStart,UTF32 *sourceEnd,UTF16 **targetStart,UTF16 *targetEnd,
          ConversionFlags flags)

{
  uint uVar1;
  bool bVar2;
  ConversionResult CVar3;
  ConversionResult CVar4;
  UTF16 *pUVar5;
  uint *puVar6;
  
  puVar6 = *sourceStart;
  pUVar5 = *targetStart;
  CVar4 = conversionOK;
  do {
    if (sourceEnd <= puVar6) break;
    CVar3 = targetExhausted;
    if (pUVar5 < targetEnd) {
      uVar1 = *puVar6;
      if (uVar1 < 0x10000) {
        if ((uVar1 & 0xf800) == 0xd800) {
          if (flags == strictConversion) {
            CVar3 = sourceIllegal;
            goto LAB_00178b88;
          }
          *pUVar5 = 0xfffd;
        }
        else {
          *pUVar5 = (ushort)uVar1;
        }
        pUVar5 = pUVar5 + 1;
      }
      else if (uVar1 < 0x110000) {
        if (targetEnd <= pUVar5 + 1) goto LAB_00178b88;
        *pUVar5 = (short)(uVar1 + 0x3ff0000 >> 10) + 0xd800;
        pUVar5[1] = (ushort)uVar1 & 0x3ff | 0xdc00;
        pUVar5 = pUVar5 + 2;
      }
      else if (flags == strictConversion) {
        CVar4 = sourceIllegal;
      }
      else {
        *pUVar5 = 0xfffd;
        pUVar5 = pUVar5 + 1;
      }
      bVar2 = true;
      puVar6 = puVar6 + 1;
    }
    else {
LAB_00178b88:
      CVar4 = CVar3;
      bVar2 = false;
    }
  } while (bVar2);
  *sourceStart = puVar6;
  *targetStart = pUVar5;
  return CVar4;
}

Assistant:

ConversionResult ConvertUTF32toUTF16 (
        const UTF32** sourceStart, const UTF32* sourceEnd,
        UTF16** targetStart, UTF16* targetEnd, ConversionFlags flags) {
    ConversionResult result = conversionOK;
    const UTF32* source = *sourceStart;
    UTF16* target = *targetStart;
    while (source < sourceEnd) {
        UTF32 ch;
        if (target >= targetEnd) {
            result = targetExhausted; break;
        }
        ch = *source++;
        if (ch <= UNI_MAX_BMP) { /* Target is a character <= 0xFFFF */
            /* UTF-16 surrogate values are illegal in UTF-32; 0xffff or 0xfffe are both reserved values */
            if (ch >= UNI_SUR_HIGH_START && ch <= UNI_SUR_LOW_END) {
                if (flags == strictConversion) {
                    --source; /* return to the illegal value itself */
                    result = sourceIllegal;
                    break;
                } else {
                    *target++ = UNI_REPLACEMENT_CHAR;
                }
            } else {
                *target++ = (UTF16)ch; /* normal case */
            }
        } else if (ch > UNI_MAX_LEGAL_UTF32) {
            if (flags == strictConversion) {
                result = sourceIllegal;
            } else {
                *target++ = UNI_REPLACEMENT_CHAR;
            }
        } else {
            /* target is a character in range 0xFFFF - 0x10FFFF. */
            if (target + 1 >= targetEnd) {
                --source; /* Back up source pointer! */
                result = targetExhausted; break;
            }
            ch -= halfBase;
            *target++ = (UTF16)((ch >> halfShift) + UNI_SUR_HIGH_START);
            *target++ = (UTF16)((ch & halfMask) + UNI_SUR_LOW_START);
        }
    }
    *sourceStart = source;
    *targetStart = target;
    return result;
}